

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void crnlib::dxt_hc::determine_color_endpoints::Node::sort_task(uint64 data,void *ptr)

{
  std::__sort<std::pair<crnlib::vec<6u,float>,unsigned_int>*,__gnu_cxx::__ops::_Iter_less_iter>
            (*ptr,*(undefined8 *)((long)ptr + 8));
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }